

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

void __thiscall transaction_tests::test_IsStandard::test_method(test_IsStandard *this)

{
  uchar uVar1;
  uint uVar2;
  undefined4 uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 *puVar23;
  const_iterator cVar24;
  pointer puVar25;
  pointer pCVar26;
  undefined8 uVar27;
  bool bVar28;
  undefined1 (*pauVar29) [16];
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar30;
  CScript *pCVar31;
  prevector<28u,unsigned_char,unsigned_int,int> *this_00;
  pointer pbVar32;
  pointer __s;
  uint uVar33;
  string *reason_in;
  string *reason_in_00;
  string *reason_in_01;
  string *reason_in_02;
  string *reason_in_03;
  string *reason_in_04;
  string *reason_in_05;
  string *reason_in_06;
  string *reason_in_07;
  string *reason_in_08;
  string *reason_in_09;
  string *reason_in_10;
  string *reason_in_11;
  string *reason_in_12;
  string *reason_in_13;
  string *reason_in_14;
  string *reason_in_15;
  string *reason_in_16;
  string *reason_in_17;
  string *reason_in_18;
  string *reason_in_19;
  string *reason_in_20;
  string *reason_in_21;
  string *reason_in_22;
  opcodetype opcode_00;
  CMutableTransaction *pCVar34;
  const_iterator end;
  pointer pCVar35;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar36;
  iterator in_R8;
  iterator pvVar37;
  iterator in_R9;
  iterator pvVar38;
  int iVar39;
  char *__end;
  pointer puVar40;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  span<const_std::byte,_18446744073709551615UL> b_08;
  span<const_std::byte,_18446744073709551615UL> b_09;
  span<const_std::byte,_18446744073709551615UL> b_10;
  span<const_std::byte,_18446744073709551615UL> b_11;
  span<const_std::byte,_18446744073709551615UL> b_12;
  span<const_std::byte,_18446744073709551615UL> b_13;
  span<const_std::byte,_18446744073709551615UL> b_14;
  initializer_list<unsigned_char> __l;
  span<const_std::byte,_18446744073709551615UL> b_15;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b_16;
  const_string file_03;
  initializer_list<CPubKey> __l_00;
  span<const_std::byte,_18446744073709551615UL> b_17;
  span<const_std::byte,_18446744073709551615UL> b_18;
  span<const_std::byte,_18446744073709551615UL> b_19;
  span<const_std::byte,_18446744073709551615UL> b_20;
  span<const_std::byte,_18446744073709551615UL> b_21;
  span<const_std::byte,_18446744073709551615UL> b_22;
  span<const_std::byte,_18446744073709551615UL> b_23;
  span<const_std::byte,_18446744073709551615UL> b_24;
  span<const_std::byte,_18446744073709551615UL> b_25;
  initializer_list<unsigned_char> __l_01;
  span<const_std::byte,_18446744073709551615UL> b_26;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar41;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined4 local_4e8;
  int local_4e4;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> non_push_ops;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  CAmount nDustThreshold;
  CKey key;
  CMutableTransaction t;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> dummyTransactions;
  CCoinsView coinsDummy;
  undefined1 local_3d0 [16];
  char *local_3c0 [2];
  assertion_result local_3b0;
  undefined1 local_398 [12];
  undefined4 uStack_38c;
  undefined1 local_388 [8];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_380 [4];
  undefined1 local_318 [8];
  undefined1 auStack_310 [16];
  pointer local_300;
  opcodetype opcode;
  undefined1 uStack_2f4;
  undefined1 uStack_2f3;
  undefined1 uStack_2f2;
  undefined1 uStack_2f1;
  undefined4 uStack_2f0;
  undefined1 uStack_2ec;
  undefined1 uStack_2eb;
  undefined1 uStack_2ea;
  undefined1 uStack_2e9;
  shared_count local_2e8;
  undefined8 uStack_2e0;
  CCoinsViewCache coins;
  FillableSigningProvider keystore;
  undefined1 local_58 [28];
  size_type sStack_3c;
  pointer local_38;
  
  local_3b0.m_message.pn.pi_ = (sp_counted_base *)local_3b0.m_message.px;
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013bce20;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore._96_16_ = (undefined1  [16])0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._24_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._32_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_12_ =
       ZEXT412(1) << 0x40;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._20_4_ = 0;
  coinsDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013bb510;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CCoinsViewCache::CCoinsViewCache(&coins,&coinsDummy,false);
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x14fb180;
  local_388 = (undefined1  [8])0x1406f40;
  local_398._0_8_ = &LAB_00a7d8be_2;
  stack0xfffffffffffffc70 = (pointer)0x2faf080;
  SetupDummyInputs(&dummyTransactions,&keystore,&coins,(array<long,_4UL> *)local_398);
  CMutableTransaction::CMutableTransaction(&t);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,1);
  CMutableTransaction::GetHash
            ((Txid *)local_398,
             dummyTransactions.
             super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
             super__Vector_impl_data._M_start);
  pCVar35 = t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
            _M_start;
  *(undefined1 (*) [8])
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) = local_388;
  *(pointer *)
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(undefined8 *)
   ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_398._0_8_;
  *(undefined8 *)
   (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       stack0xfffffffffffffc70;
  ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
   )->prevout).n = 1;
  pauVar29 = (undefined1 (*) [16])operator_new(0x41);
  pauVar29[3] = (undefined1  [16])0x0;
  pauVar29[2] = (undefined1  [16])0x0;
  pauVar29[1] = (undefined1  [16])0x0;
  *pauVar29 = (undefined1  [16])0x0;
  pauVar29[4][0] = 0;
  b._M_extent._M_extent_value = 0x41;
  b._M_ptr = (pointer)pauVar29;
  CScript::operator<<(&pCVar35->scriptSig,b);
  operator_delete(pauVar29,0x41);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&t.vout,1);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 90000000;
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey((CPubKey *)&opcode,&key);
  auStack_310._0_12_ = stack0xfffffffffffffcf8;
  PKHash::PKHash((PKHash *)local_318,(CPubKey *)&opcode);
  pCVar34 = (CMutableTransaction *)local_398;
  local_388._0_4_ = auStack_310._8_4_;
  stack0xfffffffffffffc70 = auStack_310._0_8_;
  local_398._0_8_ = local_318;
  avStack_380[2].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = '\x02';
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)pCVar34);
  pCVar26 = t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar31 = &(t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  if (0x1c < ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar31->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(local_58._16_4_,local_58._12_4_);
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0x14) =
       CONCAT44(local_58._24_4_,local_58._20_4_);
  (pCVar31->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_58._0_8_;
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 8) =
       CONCAT44(local_58._12_4_,local_58._8_4_);
  (pCVar26->scriptPubKey).super_CScriptBase._size = sStack_3c;
  sStack_3c = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  nDustThreshold = (g_dust.nSatoshisPerK * 0xb6) / 1000;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x32f;
  file.m_begin = (iterator)&local_450;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_460,msg);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abb30;
  local_58._16_4_ = 0x13c0138;
  local_58._20_4_ = 0;
  local_58._24_4_ = 0xf6cf21;
  sStack_3c = 0;
  local_3c0[0] = local_3d0 + 8;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&nDustThreshold;
  local_318[0] = nDustThreshold == 0x222;
  local_3d0._8_4_ = 0x222;
  auStack_310._0_8_ = (element_type *)0x0;
  auStack_310._8_8_ = (sp_counted_base *)0x0;
  local_3b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3b0.m_message.px = (element_type *)0xf42068;
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_013abed0;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&non_push_ops;
  local_388 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  uStack_2f0 = uStack_2f0 & 0xffffff00;
  opcode = 0x13abcf0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_._0_1_ = '8';
  local_2e8.pi_._1_1_ = '\x01';
  local_2e8.pi_._2_1_ = '<';
  local_2e8.pi_._3_1_ = '\x01';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  pvVar37 = (iterator)0x1;
  pvVar38 = (iterator)0x2;
  uStack_2e0 = local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_318,(lazy_ostream *)local_58,1,2,REQUIRE,0xf42797,
             (size_t)&local_3b0,0x32f,
             (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)local_398,"546",(CPubKey *)&opcode);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_310 + 8));
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = nDustThreshold + -1;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  pCVar34 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,pCVar34,reason_in);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    pCVar34 = (CMutableTransaction *)((long)local_388 + 1);
    operator_delete((void *)local_398._0_8_,(ulong)pCVar34);
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = nDustThreshold;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  t.version = 0xffffffff;
  local_398._0_8_ = (pointer)local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"version","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_00);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  t.version = 0;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"version","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_01);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  t.version = 4;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"version","");
  pCVar34 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,pCVar34,reason_in_02);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    pCVar34 = (CMutableTransaction *)((long)local_388 + 1);
    operator_delete((void *)local_398._0_8_,(ulong)pCVar34);
  }
  t.version = 1;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  t.version = 2;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  g_dust.nSatoshisPerK = 0xe76;
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a1;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  pCVar34 = (CMutableTransaction *)local_398;
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_03);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    pCVar34 = (CMutableTransaction *)((long)local_388 + 1);
    operator_delete((void *)local_398._0_8_,(ulong)pCVar34);
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a2;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  g_dust.nSatoshisPerK = 3000;
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"scriptpubkey","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_04);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  memcpy(local_398,util::hex_literals::detail::Hex<161ul>{std::array<std::byte_80ul>,0x50);
  b_00._M_extent._M_extent_value = 0x50;
  b_00._M_ptr = local_398;
  ppVar30 = &CScript::operator<<((CScript *)&opcode,b_00)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
    opcode = OP_0;
    uStack_2f4 = '\0';
    uStack_2f3 = '\0';
    uStack_2f2 = '\0';
    uStack_2f1 = '\0';
  }
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x358;
  file_00.m_begin = (iterator)&local_470;
  msg_00.m_end = pvVar38;
  msg_00.m_begin = pvVar37;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_480,
             msg_00);
  pCVar34 = (CMutableTransaction *)local_58;
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abb30;
  local_58._16_4_ = 0x13c0138;
  local_58._20_4_ = 0;
  local_58._24_4_ = 0xf6cf21;
  sStack_3c = 0;
  uVar2 = ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  local_3d0._8_4_ = uVar33;
  local_318[0] = uVar33 == 0x53;
  auStack_310._0_8_ = (element_type *)0x0;
  auStack_310._8_8_ = (sp_counted_base *)0x0;
  local_3b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3b0.m_message.px = (element_type *)0xf42068;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "S";
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_388 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_3c0[0] = local_3d0 + 8;
  uStack_2f0 = uStack_2f0 & 0xffffff00;
  opcode = 0x13abbb0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_._0_1_ = '8';
  local_2e8.pi_._1_1_ = '\x01';
  local_2e8.pi_._2_1_ = '<';
  local_2e8.pi_._3_1_ = '\x01';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  pvVar37 = (iterator)0x1;
  pvVar38 = (iterator)0x2;
  uStack_2e0 = local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_318,(lazy_ostream *)pCVar34,1,2,REQUIRE,0xf427af,
             (size_t)&local_3b0,0x358,local_398,"t.vout[0].scriptPubKey.size()",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_310 + 8));
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  memcpy(local_398,util::hex_literals::detail::Hex<163ul>{std::array<std::byte_81ul>,0x51);
  b_01._M_extent._M_extent_value = 0x51;
  b_01._M_ptr = local_398;
  ppVar30 = &CScript::operator<<((CScript *)&opcode,b_01)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
    opcode = OP_0;
    uStack_2f4 = '\0';
    uStack_2f3 = '\0';
    uStack_2f2 = '\0';
    uStack_2f1 = '\0';
  }
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x35d;
  file_01.m_begin = (iterator)&local_490;
  msg_01.m_end = pvVar38;
  msg_01.m_begin = pvVar37;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4a0,
             msg_01);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abb30;
  local_58._16_4_ = 0x13c0138;
  local_58._20_4_ = 0;
  local_58._24_4_ = 0xf6cf21;
  sStack_3c = 0;
  local_3d0._8_4_ = 0x54;
  uVar2 = ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size;
  local_3d0._0_4_ = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    local_3d0._0_4_ = uVar2;
  }
  local_3c0[0] = local_3d0;
  local_318[0] = local_3d0._0_4_ == 0x54;
  auStack_310._0_8_ = (element_type *)0x0;
  auStack_310._8_8_ = (sp_counted_base *)0x0;
  local_3b0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3b0.m_message.px = (element_type *)0xf42068;
  non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = local_3d0 + 8;
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_388 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  uStack_2f0 = uStack_2f0 & 0xffffff00;
  opcode = 0x13abbb0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_._0_1_ = '8';
  local_2e8.pi_._1_1_ = '\x01';
  local_2e8.pi_._2_1_ = '<';
  local_2e8.pi_._3_1_ = '\x01';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  pvVar37 = (iterator)0x1;
  pvVar38 = (iterator)0x2;
  uStack_2e0 = local_3c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_318,(lazy_ostream *)local_58,1,2,REQUIRE,0xf427e1,
             (size_t)&local_3b0,0x35d,local_398,"t.vout[0].scriptPubKey.size()",(CScript *)&opcode);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_310 + 8));
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"scriptpubkey","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_05);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pCVar34 = (CMutableTransaction *)
            CScript::operator<<((CScript *)local_398,
                                (span<const_std::byte,_18446744073709551615UL>)ZEXT816(0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar34);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar5 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  opcode = opcode & ~OP_INVALIDOPCODE;
  b_02._M_extent._M_extent_value = 1;
  b_02._M_ptr = (pointer)&opcode;
  pCVar31 = CScript::operator<<((CScript *)local_398,b_02);
  local_58[0] = 1;
  b_03._M_extent._M_extent_value = 1;
  b_03._M_ptr = local_58;
  pCVar34 = (CMutableTransaction *)CScript::operator<<(pCVar31,b_03);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar34);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar6 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = CONCAT31(opcode._1_3_,0x50);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (uchar *)((long)&pCVar35->prevout + (long)(int)uVar3),(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x4f);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)local_398,(uchar *)&opcode);
  opcode = opcode & ~OP_INVALIDOPCODE;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)local_398,(uchar *)&opcode);
  local_58[0] = 1;
  b_04._M_extent._M_extent_value = 1;
  b_04._M_ptr = local_58;
  pCVar34 = (CMutableTransaction *)CScript::operator<<((CScript *)local_398,b_04);
  opcode = CONCAT31(opcode._1_3_,0x52);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x53);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x54);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x55);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x56);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x57);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x58);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x59);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5a);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5b);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5c);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5d);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5e);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x5f);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  opcode = CONCAT31(opcode._1_3_,0x60);
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)pCVar34,(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar34);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar7 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 'j';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  local_398[0] = '\0';
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)&opcode,local_398);
  local_58[0] = 1;
  b_05._M_extent._M_extent_value = 1;
  b_05._M_ptr = local_58;
  this_00 = (prevector<28u,unsigned_char,unsigned_int,int> *)
            CScript::operator<<((CScript *)&opcode,b_05);
  local_398[0] = 0x52;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            (this_00,local_398);
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = 0xffffffff;
  local_388 = (undefined1  [8])0xffffffffffffffff;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = 0xffffffff;
  local_398._8_4_ = 0xffffffff;
  local_398._0_8_ = 0xffffffffffffffff;
  uStack_38c = 0xffffffff;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)CONCAT44(avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,0xffffffff);
  b_06._M_extent._M_extent_value = 0x24;
  b_06._M_ptr = (pointer)local_398;
  pCVar34 = (CMutableTransaction *)CScript::operator<<((CScript *)this_00,b_06);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar34);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
    opcode = OP_0;
    uStack_2f4 = '\0';
    uStack_2f3 = '\0';
    uStack_2f2 = '\0';
    uStack_2f1 = '\0';
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (uchar *)((long)&pCVar35->prevout + (long)(int)uVar3),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"scriptpubkey","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_06);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&t.vout,1);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pCVar34 = (CMutableTransaction *)local_398;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)pCVar34);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar8 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&t.vout,2);
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xde611feae06279a6;
  local_388 = (undefined1  [8])0x939e028a8d65c10;
  stack0xfffffffffffffc70 = 0xb73071a6f1671927;
  local_398._0_8_ = 0x4855feb0fd8a6704;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x38ef4c3fbcf649b6;
  b_07._M_extent._M_extent_value = 0x28;
  b_07._M_ptr = local_398;
  ppVar30 = &CScript::operator<<((CScript *)&opcode,b_07)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0;
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xde611feae06279a6;
  local_388 = (undefined1  [8])0x939e028a8d65c10;
  local_398._0_8_ = (pointer)0x4855feb0fd8a6704;
  stack0xfffffffffffffc70 = (pointer)0xb73071a6f1671927;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x38ef4c3fbcf649b6;
  b_08._M_extent._M_extent_value = 0x28;
  b_08._M_ptr = local_398;
  ppVar30 = &CScript::operator<<((CScript *)&opcode,b_08)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar30);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
    opcode = OP_0;
    uStack_2f4 = '\0';
    uStack_2f3 = '\0';
    uStack_2f2 = '\0';
    uStack_2f1 = '\0';
  }
  t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 0;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"multi-op-return","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_07);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0._0_1_ = '\0';
  uStack_2e0._1_1_ = '\0';
  uStack_2e0._2_1_ = '\0';
  uStack_2e0._3_1_ = '\0';
  uStack_2e0._4_4_ = 0;
  opcode = OP_0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_398[0] = 0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&opcode,(iterator)&opcode,local_398
            );
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xde611feae06279a6;
  local_388 = (undefined1  [8])0x939e028a8d65c10;
  stack0xfffffffffffffc70 = 0xb73071a6f1671927;
  local_398._0_8_ = 0x4855feb0fd8a6704;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x38ef4c3fbcf649b6;
  b_09._M_extent._M_extent_value = 0x28;
  b_09._M_ptr = (pointer)local_398;
  ppVar30 = &CScript::operator<<((CScript *)&opcode,b_09)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  if (0x1c < uStack_2e0._4_4_) {
    free((void *)CONCAT44(_uStack_2f4,opcode));
    opcode = OP_0;
    uStack_2f4 = '\0';
    uStack_2f3 = '\0';
    uStack_2f2 = '\0';
    uStack_2f1 = '\0';
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"multi-op-return","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_08);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"multi-op-return","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_09);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&t.vout,1);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 2100000000000000;
  CKey::GetPubKey((CPubKey *)&opcode,&key);
  PKHash::PKHash((PKHash *)local_318,(CPubKey *)&opcode);
  local_388._0_4_ = auStack_310._8_4_;
  stack0xfffffffffffffc70 = auStack_310._0_8_;
  local_398._0_8_ = local_318;
  avStack_380[2].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = '\x02';
  GetScriptForDestination((CScript *)local_58,(CTxDestination *)local_398);
  pCVar26 = t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar31 = &(t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  if (0x1c < ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar31->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(local_58._16_4_,local_58._12_4_);
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0x14) =
       CONCAT44(local_58._24_4_,local_58._20_4_);
  (pCVar31->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_58._0_8_;
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 8) =
       CONCAT44(local_58._12_4_,local_58._8_4_);
  (pCVar26->scriptPubKey).super_CScriptBase._size = sStack_3c;
  sStack_3c = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_398);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pbVar32 = (pointer)operator_new(0x66f);
  memset(pbVar32,0,0x66f);
  b_10._M_extent._M_extent_value = 0x66f;
  b_10._M_ptr = pbVar32;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_10)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x66f;
  operator_delete(pbVar32,0x66f);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar9 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pbVar32 = (pointer)operator_new(0x670);
  memset(pbVar32,0,0x670);
  b_11._M_extent._M_extent_value = 0x670;
  b_11._M_ptr = pbVar32;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_11)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar30);
  operator_delete(pbVar32,0x670);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"scriptsig-size","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_10);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = opcode & ~OP_INVALIDOPCODE;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (iterator)
             ((pCVar35->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
             (long)(int)uVar3),(uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = CONCAT31(opcode._1_3_,0x4f);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (iterator)
             ((pCVar35->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
             (long)(int)uVar3),(uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = CONCAT31(opcode._1_3_,0x60);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (iterator)
             ((pCVar35->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
             (long)(int)uVar3),(uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x4b);
  *(undefined1 (*) [16])(pauVar29[3] + 0xb) = (undefined1  [16])0x0;
  pauVar29[3] = (undefined1  [16])0x0;
  pauVar29[2] = (undefined1  [16])0x0;
  pauVar29[1] = (undefined1  [16])0x0;
  *pauVar29 = (undefined1  [16])0x0;
  b_12._M_extent._M_extent_value = 0x4b;
  b_12._M_ptr = (pointer)pauVar29;
  pCVar31 = CScript::operator<<((CScript *)local_398,b_12);
  pbVar32 = (pointer)operator_new(0xeb);
  memset(pbVar32,0,0xeb);
  b_13._M_extent._M_extent_value = 0xeb;
  b_13._M_ptr = pbVar32;
  pCVar31 = CScript::operator<<(pCVar31,b_13);
  __s = (pointer)operator_new(0x4d2);
  memset(__s,0,0x4d2);
  b_14._M_extent._M_extent_value = 0x4d2;
  b_14._M_ptr = __s;
  ppVar30 = &CScript::operator<<(pCVar31,b_14)->super_CScriptBase;
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0x59);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar30);
  operator_delete(__s,0x4d2);
  operator_delete(pbVar32,0xeb);
  pCVar34 = (CMutableTransaction *)0x4b;
  operator_delete(pauVar29,0x4b);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar10 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  auVar5 = _local_398;
  local_398._8_4_ = 0xacabaa94;
  local_398._0_8_ = 0x9387826f7b636961;
  uStack_38c._1_3_ = auVar5._13_3_;
  uStack_38c._0_1_ = 0xb1;
  __l._M_len = 0xd;
  __l._M_array = local_398;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&non_push_ops,__l,(allocator_type *)&opcode);
  pc.ptr = (uchar *)&(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig;
  if (0x1c < ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size) {
    pc.ptr = (uchar *)((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                      indirect_contents.indirect;
  }
  uVar2 = ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
           _M_start)->scriptSig).super_CScriptBase._size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  pCVar31 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig;
  if (uVar2 >= 0x1d) {
    pCVar31 = (CScript *)
              ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
              indirect_contents.indirect;
  }
  end.ptr = (uchar *)((long)&(pCVar31->super_CScriptBase)._union + (long)(int)uVar33);
  if (pc.ptr < end.ptr) {
    do {
      cVar24.ptr = pc.ptr;
      GetScriptOp(&pc,end,&opcode,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
      puVar25 = non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (0x4d < opcode + ~OP_0) {
        if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
          iVar39 = (int)t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x28;
        }
        else {
          iVar39 = (int)*(undefined8 *)
                         &((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union;
        }
        uVar1 = *cVar24.ptr;
        iVar39 = (int)cVar24.ptr - iVar39;
        if (non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          puVar40 = non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
              pCVar31 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->scriptSig;
            }
            else {
              pCVar31 = (CScript *)
                        ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                        indirect_contents.indirect;
            }
            (pCVar31->super_CScriptBase)._union.direct[iVar39] = *puVar40;
            local_398._0_8_ = local_388;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_398,"scriptsig-not-pushonly","");
            end.ptr = (uchar *)local_398;
            test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_11);
            if ((pointer)local_398._0_8_ != (pointer)local_388) {
              end.ptr = (uchar *)((long)local_388 + 1);
              operator_delete((void *)local_398._0_8_,(ulong)end.ptr);
            }
            puVar40 = puVar40 + 1;
          } while (puVar40 != puVar25);
        }
        if (((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size < 0x1d) {
          pCVar31 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig;
        }
        else {
          pCVar31 = (CScript *)
                    ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                    indirect_contents.indirect;
        }
        (pCVar31->super_CScriptBase)._union.direct[iVar39] = uVar1;
        test_method()::$_0::operator()((__0 *)&t,(CMutableTransaction *)end.ptr);
      }
      uVar2 = ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size;
      uVar33 = uVar2 - 0x1d;
      if (uVar2 < 0x1d) {
        uVar33 = uVar2;
      }
      pCVar31 = &(t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig;
      if (uVar2 >= 0x1d) {
        pCVar31 = (CScript *)
                  ((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
                  indirect_contents.indirect;
      }
      end.ptr = (uchar *)((long)&(pCVar31->super_CScriptBase)._union + (long)(int)uVar33);
    } while (pc.ptr < end.ptr);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&t.vin,t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,0x986);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x13);
  *pauVar29 = (undefined1  [16])0x0;
  *(undefined4 *)(*pauVar29 + 0xf) = 0;
  b_15._M_extent._M_extent_value = 0x13;
  b_15._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_15)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  operator_delete(pauVar29,0x13);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar11 << 0x40;
  }
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3b9;
  file_02.m_begin = (iterator)&local_4d0;
  msg_02.m_end = pvVar38;
  msg_02.m_begin = pvVar37;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4e0,
             msg_02);
  auStack_310._0_8_ = auStack_310._1_8_ << 8;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  auStack_310._8_8_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_300 = (pointer)0xf6cf21;
  CTransaction::CTransaction((CTransaction *)local_398,&t);
  local_58._0_8_ = (char *)0x0;
  opcode = 0xf42ba2;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  _uStack_2f0 = local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_398,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode
             ,&::TX_NO_WITNESS);
  uVar27 = local_58._0_8_;
  local_58._0_8_ = (char *)0x0;
  opcode = 0xf42ba1;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  _uStack_2f0 = local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_398,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode
             ,&::TX_WITH_WITNESS);
  local_4e4 = (int)uVar27 * 3 + local_58._0_4_;
  local_4e8 = 400000;
  local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_4e4 == 400000);
  local_3b0.m_message.px = (element_type *)0x0;
  local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c0[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3c0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                         + 0x6a);
  uStack_2f0 = uStack_2f0 & 0xffffff00;
  opcode = 0x13abcf0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_._0_1_ = '8';
  local_2e8.pi_._1_1_ = '\x01';
  local_2e8.pi_._2_1_ = '<';
  local_2e8.pi_._3_1_ = '\x01';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0 = (char **)(local_3d0 + 8);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_58._16_4_ = 0x13c0138;
  local_58._20_4_ = 0;
  unique0x00005300 = (pointer)local_3d0;
  pCVar34 = (CMutableTransaction *)local_318;
  pvVar37 = (iterator)0x1;
  pvVar38 = (iterator)0x2;
  local_3d0._0_8_ = &local_4e8;
  local_3d0._8_8_ = &local_4e4;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b0,(lazy_ostream *)pCVar34,1,2,REQUIRE,0xf4282f,(size_t)local_3c0,0x3b9,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode,"400000",local_58);
  boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_388 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_398);
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x6a);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x14);
  *pauVar29 = (undefined1  [16])0x0;
  *(undefined4 *)pauVar29[1] = 0;
  b_16._M_extent._M_extent_value = 0x14;
  b_16._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_16)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  operator_delete(pauVar29,0x14);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar12 << 0x40;
  }
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3be;
  file_03.m_begin = (iterator)&local_4f8;
  msg_03.m_end = pvVar38;
  msg_03.m_begin = pvVar37;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_508,
             msg_03);
  auStack_310._0_8_ = auStack_310._1_8_ << 8;
  local_318 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
  auStack_310._8_8_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_300 = (pointer)0xf6cf21;
  CTransaction::CTransaction((CTransaction *)local_398,&t);
  local_58._0_8_ = (char *)0x0;
  opcode = 0xf42ba2;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  _uStack_2f0 = local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_398,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode
             ,&::TX_NO_WITNESS);
  uVar27 = local_58._0_8_;
  local_58._0_8_ = (char *)0x0;
  opcode = 0xf42ba1;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  _uStack_2f0 = local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_398,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode
             ,&::TX_WITH_WITNESS);
  local_4e4 = (int)uVar27 * 3 + local_58._0_4_;
  local_4e8 = 0x61a84;
  local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_4e4 == 0x61a84);
  local_3b0.m_message.px = (element_type *)0x0;
  local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c0[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3c0[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                         + 0x6a);
  uStack_2f0 = uStack_2f0 & 0xffffff00;
  opcode = 0x13abcf0;
  uStack_2f4 = '\0';
  uStack_2f3 = '\0';
  uStack_2f2 = '\0';
  uStack_2f1 = '\0';
  local_2e8.pi_._0_1_ = '8';
  local_2e8.pi_._1_1_ = '\x01';
  local_2e8.pi_._2_1_ = '<';
  local_2e8.pi_._3_1_ = '\x01';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  uStack_2e0 = (char **)(local_3d0 + 8);
  local_58._8_4_ = local_58._8_4_ & 0xffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_58._16_4_ = 0x13c0138;
  local_58._20_4_ = 0;
  unique0x00005300 = (pointer)local_3d0;
  pvVar37 = (iterator)0x1;
  pvVar38 = (iterator)0x2;
  local_3d0._0_8_ = &local_4e8;
  local_3d0._8_8_ = &local_4e4;
  boost::test_tools::tt_detail::report_assertion
            (&local_3b0,(lazy_ostream *)local_318,1,2,REQUIRE,0xf4282f,(size_t)local_3c0,0x3be,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&opcode,"400004",local_58);
  boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_388 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_398);
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"tx-size","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_12);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  g_bare_multi = 0;
  CKey::GetPubKey((CPubKey *)local_398,&key);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_398;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)local_58,__l_00,
             (allocator_type *)local_318);
  GetScriptForMultisig((CScript *)&opcode,1,(vector<CPubKey,_std::allocator<CPubKey>_> *)local_58);
  pCVar26 = t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar31 = &(t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptPubKey;
  puVar23 = (undefined1 *)uStack_2e0;
  if (0x1c < ((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
    free((pCVar31->super_CScriptBase)._union.indirect_contents.indirect);
    puVar23 = (undefined1 *)uStack_2e0;
  }
  uStack_2e0._4_4_ = (size_type)((ulong)puVar23 >> 0x20);
  uStack_2e0._0_4_ = SUB84(puVar23,0);
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0xc) =
       CONCAT44(local_2e8.pi_._0_4_,_uStack_2ec);
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 0x14) =
       CONCAT44((undefined4)uStack_2e0,local_2e8.pi_._4_4_);
  (pCVar31->super_CScriptBase)._union.indirect_contents.indirect =
       (char *)CONCAT44(_uStack_2f4,opcode);
  *(ulong *)((long)&(pCVar26->scriptPubKey).super_CScriptBase._union + 8) =
       CONCAT44(_uStack_2ec,uStack_2f0);
  (pCVar26->scriptPubKey).super_CScriptBase._size = uStack_2e0._4_4_;
  uStack_2e0._4_4_ = 0;
  if ((undefined **)local_58._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_58._0_8_,
                    CONCAT44(local_58._20_4_,local_58._16_4_) - local_58._0_8_);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&t.vin,1);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pauVar29 = (undefined1 (*) [16])operator_new(0x41);
  pauVar29[3] = (undefined1  [16])0x0;
  pauVar29[2] = (undefined1  [16])0x0;
  pauVar29[1] = (undefined1  [16])0x0;
  *pauVar29 = (undefined1  [16])0x0;
  pauVar29[4][0] = 0;
  b_17._M_extent._M_extent_value = 0x41;
  b_17._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_17)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x41;
  operator_delete(pauVar29,0x41);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar13 << 0x40;
  }
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  g_bare_multi = 1;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"bare-multisig","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_13);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  g_bare_multi = 0;
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pbVar32 = (pointer)operator_new(0x21);
  pbVar32[0x10] = 2;
  pbVar32[0x11] = 2;
  pbVar32[0x12] = 2;
  pbVar32[0x13] = 2;
  pbVar32[0x14] = 2;
  pbVar32[0x15] = 2;
  pbVar32[0x16] = 2;
  pbVar32[0x17] = 2;
  pbVar32[0x18] = 2;
  pbVar32[0x19] = 2;
  pbVar32[0x1a] = 2;
  pbVar32[0x1b] = 2;
  pbVar32[0x1c] = 2;
  pbVar32[0x1d] = 2;
  pbVar32[0x1e] = 2;
  pbVar32[0x1f] = 2;
  pbVar32[0] = 2;
  pbVar32[1] = 2;
  pbVar32[2] = 2;
  pbVar32[3] = 2;
  pbVar32[4] = 2;
  pbVar32[5] = 2;
  pbVar32[6] = 2;
  pbVar32[7] = 2;
  pbVar32[8] = 2;
  pbVar32[9] = 2;
  pbVar32[10] = 2;
  pbVar32[0xb] = 2;
  pbVar32[0xc] = 2;
  pbVar32[0xd] = 2;
  pbVar32[0xe] = 2;
  pbVar32[0xf] = 2;
  pbVar32[0x20] = 2;
  b_18._M_extent._M_extent_value = 0x21;
  b_18._M_ptr = pbVar32;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_18)->super_CScriptBase;
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x21;
  operator_delete(pbVar32,0x21);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar14 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x240;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x23f;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_14);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  pbVar32 = (pointer)operator_new(0x41);
  pbVar32[0x30] = 4;
  pbVar32[0x31] = 4;
  pbVar32[0x32] = 4;
  pbVar32[0x33] = 4;
  pbVar32[0x34] = 4;
  pbVar32[0x35] = 4;
  pbVar32[0x36] = 4;
  pbVar32[0x37] = 4;
  pbVar32[0x38] = 4;
  pbVar32[0x39] = 4;
  pbVar32[0x3a] = 4;
  pbVar32[0x3b] = 4;
  pbVar32[0x3c] = 4;
  pbVar32[0x3d] = 4;
  pbVar32[0x3e] = 4;
  pbVar32[0x3f] = 4;
  pbVar32[0x20] = 4;
  pbVar32[0x21] = 4;
  pbVar32[0x22] = 4;
  pbVar32[0x23] = 4;
  pbVar32[0x24] = 4;
  pbVar32[0x25] = 4;
  pbVar32[0x26] = 4;
  pbVar32[0x27] = 4;
  pbVar32[0x28] = 4;
  pbVar32[0x29] = 4;
  pbVar32[0x2a] = 4;
  pbVar32[0x2b] = 4;
  pbVar32[0x2c] = 4;
  pbVar32[0x2d] = 4;
  pbVar32[0x2e] = 4;
  pbVar32[0x2f] = 4;
  pbVar32[0x10] = 4;
  pbVar32[0x11] = 4;
  pbVar32[0x12] = 4;
  pbVar32[0x13] = 4;
  pbVar32[0x14] = 4;
  pbVar32[0x15] = 4;
  pbVar32[0x16] = 4;
  pbVar32[0x17] = 4;
  pbVar32[0x18] = 4;
  pbVar32[0x19] = 4;
  pbVar32[0x1a] = 4;
  pbVar32[0x1b] = 4;
  pbVar32[0x1c] = 4;
  pbVar32[0x1d] = 4;
  pbVar32[0x1e] = 4;
  pbVar32[0x1f] = 4;
  pbVar32[0] = 4;
  pbVar32[1] = 4;
  pbVar32[2] = 4;
  pbVar32[3] = 4;
  pbVar32[4] = 4;
  pbVar32[5] = 4;
  pbVar32[6] = 4;
  pbVar32[7] = 4;
  pbVar32[8] = 4;
  pbVar32[9] = 4;
  pbVar32[10] = 4;
  pbVar32[0xb] = 4;
  pbVar32[0xc] = 4;
  pbVar32[0xd] = 4;
  pbVar32[0xe] = 4;
  pbVar32[0xf] = 4;
  pbVar32[0x40] = 4;
  b_19._M_extent._M_extent_value = 0x41;
  b_19._M_ptr = pbVar32;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_19)->super_CScriptBase;
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x41;
  operator_delete(pbVar32,0x41);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar15 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x2a0;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x29f;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_15);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x76);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    uVar3 = avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  pCVar35 = (pointer)local_398._0_8_;
  if ((uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ < 0x1d) {
    pCVar35 = (pointer)local_398;
  }
  opcode = CONCAT31(opcode._1_3_,0xa9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,
             (iterator)
             ((pCVar35->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
             (long)(int)uVar3),(uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x14);
  *pauVar29 = (undefined1  [16])0x0;
  *(undefined4 *)pauVar29[1] = 0;
  b_20._M_extent._M_extent_value = 0x14;
  b_20._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_20)->super_CScriptBase;
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0x88);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x14;
  operator_delete(pauVar29,0x14);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar16 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x222;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x221;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_16);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0xa9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x14);
  *pauVar29 = (undefined1  [16])0x0;
  *(undefined4 *)pauVar29[1] = 0;
  b_21._M_extent._M_extent_value = 0x14;
  b_21._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_21)->super_CScriptBase;
  uVar2 = ppVar30->_size;
  uVar33 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar33 = uVar2;
  }
  ppVar36 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar30->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar36 = ppVar30;
  }
  opcode = CONCAT31(opcode._1_3_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar30,(uchar *)((long)&ppVar36->_union + (long)(int)uVar33),(uchar *)&opcode);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x14;
  operator_delete(pauVar29,0x14);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar17 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x21c;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x21b;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_17);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = opcode & ~OP_INVALIDOPCODE;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x14);
  *pauVar29 = (undefined1  [16])0x0;
  *(undefined4 *)pauVar29[1] = 0;
  b_22._M_extent._M_extent_value = 0x14;
  b_22._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_22)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x14;
  operator_delete(pauVar29,0x14);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar18 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x126;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x125;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_18);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = opcode & ~OP_INVALIDOPCODE;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x20);
  pauVar29[1] = (undefined1  [16])0x0;
  *pauVar29 = (undefined1  [16])0x0;
  b_23._M_extent._M_extent_value = 0x20;
  b_23._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_23)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x20;
  operator_delete(pauVar29,0x20);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar19 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x14a;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x149;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_19);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  pauVar29 = (undefined1 (*) [16])operator_new(0x20);
  pauVar29[1] = (undefined1  [16])0x0;
  *pauVar29 = (undefined1  [16])0x0;
  b_24._M_extent._M_extent_value = 0x20;
  b_24._M_ptr = (pointer)pauVar29;
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_24)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pCVar34 = (CMutableTransaction *)0x20;
  operator_delete(pauVar29,0x20);
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar20 << 0x40;
  }
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x14a;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x149;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_20);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  opcode_00 = OP_1;
  do {
    _local_388 = (undefined1  [16])0x0;
    _local_398 = (undefined1  [16])0x0;
    pCVar31 = CScript::operator<<((CScript *)local_398,opcode_00);
    pbVar32 = (pointer)operator_new(2);
    pbVar32[0] = 0;
    pbVar32[1] = 0;
    b_25._M_extent._M_extent_value = 2;
    b_25._M_ptr = pbVar32;
    ppVar30 = &CScript::operator<<(pCVar31,b_25)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
    pCVar34 = (CMutableTransaction *)0x2;
    operator_delete(pbVar32,2);
    if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_398._0_8_);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = stack0xfffffffffffffc70;
      _local_398 = auVar21 << 0x40;
    }
    (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 0xf0;
    test_method()::$_0::operator()((__0 *)&t,pCVar34);
    (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 0xef;
    local_398._0_8_ = local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
    test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_21);
    if ((pointer)local_398._0_8_ != (pointer)local_388) {
      operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
    }
    opcode_00 = opcode_00 + 1;
  } while (opcode_00 != OP_NOP);
  _local_388 = (undefined1  [16])0x0;
  _local_398 = (undefined1  [16])0x0;
  opcode = CONCAT31(opcode._1_3_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_398,(iterator)local_398,
             (uchar *)&opcode);
  local_58._0_2_ = 0x734e;
  __l_01._M_len = 2;
  __l_01._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&opcode,__l_01,
             (allocator_type *)local_318);
  b_26._M_extent._M_extent_value =
       CONCAT44(_uStack_2ec,uStack_2f0) - (long)CONCAT44(_uStack_2f4,opcode);
  b_26._M_ptr = (pointer)CONCAT44(_uStack_2f4,opcode);
  ppVar30 = &CScript::operator<<((CScript *)local_398,b_26)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar30);
  pvVar4 = (void *)CONCAT44(_uStack_2f4,opcode);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_2e8.pi_._4_4_,local_2e8.pi_._0_4_) - (long)pvVar4);
  }
  if (0x1c < (uint)avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_398._0_8_);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = stack0xfffffffffffffc70;
    _local_398 = auVar22 << 0x40;
  }
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x409;
  file_04.m_begin = (iterator)&local_518;
  msg_04.m_end = pvVar38;
  msg_04.m_begin = pvVar37;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_528,
             msg_04);
  _cVar41 = 0x682a97;
  bVar28 = CScript::IsPayToAnchor
                     (&(t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptPubKey);
  opcode = CONCAT31(opcode._1_3_,bVar28);
  uStack_2f0 = 0;
  uStack_2ec = '\0';
  uStack_2eb = '\0';
  uStack_2ea = '\0';
  uStack_2e9 = '\0';
  local_2e8.pi_._0_1_ = '\0';
  local_2e8.pi_._1_1_ = '\0';
  local_2e8.pi_._2_1_ = '\0';
  local_2e8.pi_._3_1_ = '\0';
  local_2e8.pi_._4_1_ = '\0';
  local_2e8.pi_._5_1_ = '\0';
  local_2e8.pi_._6_1_ = '\0';
  local_2e8.pi_._7_1_ = '\0';
  local_58._0_8_ = "t.vout[0].scriptPubKey.IsPayToAnchor()";
  local_58._8_4_ = 0xf4289f;
  local_58._12_4_ = 0;
  pCVar34 = (CMutableTransaction *)local_398;
  local_398[8] = 0;
  local_398._0_8_ = &PTR__lazy_ostream_013abc70;
  avStack_380[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_58;
  local_388 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_530 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&opcode,(lazy_ostream *)pCVar34,1,0,WARN,_cVar41,(size_t)&local_538
             ,0x409);
  boost::detail::shared_count::~shared_count(&local_2e8);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0xf0;
  test_method()::$_0::operator()((__0 *)&t,pCVar34);
  (t.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0xef;
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"dust","");
  test_method()::$_1::operator()(&t,(CMutableTransaction *)local_398,reason_in_22);
  if ((pointer)local_398._0_8_ != (pointer)local_388) {
    operator_delete((void *)local_398._0_8_,(ulong)((long)local_388 + 1));
  }
  if (non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(non_push_ops.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)non_push_ops.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)non_push_ops.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )key.keydata._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&key.keydata,
               (array<unsigned_char,_32UL> *)
               key.keydata._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&t.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&t.vin);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            (&dummyTransactions);
  coins.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&coins.cacheCoins._M_h);
  if (coins.m_sentinel.second.m_flags != '\0') {
    ((coins.m_sentinel.second.m_next)->second).m_prev = coins.m_sentinel.second.m_prev;
    ((coins.m_sentinel.second.m_prev)->second).m_next = coins.m_sentinel.second.m_next;
    coins.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
         indirect);
    coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&coins.m_cache_coins_memory_resource);
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013bce20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&keystore.mapScripts._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&keystore.mapKeys._M_t);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_IsStandard)
{
    FillableSigningProvider keystore;
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    std::vector<CMutableTransaction> dummyTransactions =
        SetupDummyInputs(keystore, coins, {11*CENT, 50*CENT, 21*CENT, 22*CENT});

    CMutableTransaction t;
    t.vin.resize(1);
    t.vin[0].prevout.hash = dummyTransactions[0].GetHash();
    t.vin[0].prevout.n = 1;
    t.vin[0].scriptSig << std::vector<unsigned char>(65, 0);
    t.vout.resize(1);
    t.vout[0].nValue = 90*CENT;
    CKey key = GenerateRandomKey();
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));

    constexpr auto CheckIsStandard = [](const auto& t) {
        std::string reason;
        BOOST_CHECK(IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK(reason.empty());
    };
    constexpr auto CheckIsNotStandard = [](const auto& t, const std::string& reason_in) {
        std::string reason;
        BOOST_CHECK(!IsStandardTx(CTransaction{t}, MAX_OP_RETURN_RELAY, g_bare_multi, g_dust, reason));
        BOOST_CHECK_EQUAL(reason_in, reason);
    };

    CheckIsStandard(t);

    // Check dust with default relay fee:
    CAmount nDustThreshold = 182 * g_dust.GetFeePerK() / 1000;
    BOOST_CHECK_EQUAL(nDustThreshold, 546);
    // dust:
    t.vout[0].nValue = nDustThreshold - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = nDustThreshold;
    CheckIsStandard(t);

    // Disallowed version
    t.version = std::numeric_limits<uint32_t>::max();
    CheckIsNotStandard(t, "version");

    t.version = 0;
    CheckIsNotStandard(t, "version");

    t.version = TX_MAX_STANDARD_VERSION + 1;
    CheckIsNotStandard(t, "version");

    // Allowed version
    t.version = 1;
    CheckIsStandard(t);

    t.version = 2;
    CheckIsStandard(t);

    // Check dust with odd relay fee to verify rounding:
    // nDustThreshold = 182 * 3702 / 1000
    g_dust = CFeeRate(3702);
    // dust:
    t.vout[0].nValue = 674 - 1;
    CheckIsNotStandard(t, "dust");
    // not dust:
    t.vout[0].nValue = 674;
    CheckIsStandard(t);
    g_dust = CFeeRate{DUST_RELAY_TX_FEE};

    t.vout[0].scriptPubKey = CScript() << OP_1;
    CheckIsNotStandard(t, "scriptpubkey");

    // MAX_OP_RETURN_RELAY-byte TxoutType::NULL_DATA (standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY, t.vout[0].scriptPubKey.size());
    CheckIsStandard(t);

    // MAX_OP_RETURN_RELAY+1-byte TxoutType::NULL_DATA (non-standard)
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3804678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef3800"_hex;
    BOOST_CHECK_EQUAL(MAX_OP_RETURN_RELAY + 1, t.vout[0].scriptPubKey.size());
    CheckIsNotStandard(t, "scriptpubkey");

    // Data payload can be encoded in any way...
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << ""_hex;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "00"_hex << "01"_hex;
    CheckIsStandard(t);
    // OP_RESERVED *is* considered to be a PUSHDATA type opcode by IsPushOnly()!
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RESERVED << -1 << 0 << "01"_hex << 2 << 3 << 4 << 5 << 6 << 7 << 8 << 9 << 10 << 11 << 12 << 13 << 14 << 15 << 16;
    CheckIsStandard(t);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << 0 << "01"_hex << 2 << "ffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"_hex;
    CheckIsStandard(t);

    // ...so long as it only contains PUSHDATA's
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << OP_RETURN;
    CheckIsNotStandard(t, "scriptpubkey");

    // TxoutType::NULL_DATA w/o PUSHDATA
    t.vout.resize(1);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    CheckIsStandard(t);

    // Only one TxoutType::NULL_DATA permitted in all cases
    t.vout.resize(2);
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[0].nValue = 0;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].nValue = 0;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38"_hex;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    t.vout[0].scriptPubKey = CScript() << OP_RETURN;
    t.vout[1].scriptPubKey = CScript() << OP_RETURN;
    CheckIsNotStandard(t, "multi-op-return");

    // Check large scriptSig (non-standard if size is >1650 bytes)
    t.vout.resize(1);
    t.vout[0].nValue = MAX_MONEY;
    t.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
    // OP_PUSHDATA2 with len (3 bytes) + data (1647 bytes) = 1650 bytes
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1647, 0); // 1650
    CheckIsStandard(t);

    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(1648, 0); // 1651
    CheckIsNotStandard(t, "scriptsig-size");

    // Check scriptSig format (non-standard if there are any other ops than just PUSHs)
    t.vin[0].scriptSig = CScript()
        << OP_TRUE << OP_0 << OP_1NEGATE << OP_16 // OP_n (single byte pushes: n = 1, 0, -1, 16)
        << std::vector<unsigned char>(75, 0)      // OP_PUSHx [...x bytes...]
        << std::vector<unsigned char>(235, 0)     // OP_PUSHDATA1 x [...x bytes...]
        << std::vector<unsigned char>(1234, 0)    // OP_PUSHDATA2 x [...x bytes...]
        << OP_9;
    CheckIsStandard(t);

    const std::vector<unsigned char> non_push_ops = { // arbitrary set of non-push operations
        OP_NOP, OP_VERIFY, OP_IF, OP_ROT, OP_3DUP, OP_SIZE, OP_EQUAL, OP_ADD, OP_SUB,
        OP_HASH256, OP_CODESEPARATOR, OP_CHECKSIG, OP_CHECKLOCKTIMEVERIFY };

    CScript::const_iterator pc = t.vin[0].scriptSig.begin();
    while (pc < t.vin[0].scriptSig.end()) {
        opcodetype opcode;
        CScript::const_iterator prev_pc = pc;
        t.vin[0].scriptSig.GetOp(pc, opcode); // advance to next op
        // for the sake of simplicity, we only replace single-byte push operations
        if (opcode >= 1 && opcode <= OP_PUSHDATA4)
            continue;

        int index = prev_pc - t.vin[0].scriptSig.begin();
        unsigned char orig_op = *prev_pc; // save op
        // replace current push-op with each non-push-op
        for (auto op : non_push_ops) {
            t.vin[0].scriptSig[index] = op;
            CheckIsNotStandard(t, "scriptsig-not-pushonly");
        }
        t.vin[0].scriptSig[index] = orig_op; // restore op
        CheckIsStandard(t);
    }

    // Check tx-size (non-standard if transaction weight is > MAX_STANDARD_TX_WEIGHT)
    t.vin.clear();
    t.vin.resize(2438); // size per input (empty scriptSig): 41 bytes
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(19, 0); // output size: 30 bytes
    // tx header:                12 bytes =>     48 weight units
    // 2438 inputs: 2438*41 = 99958 bytes => 399832 weight units
    //    1 output:              30 bytes =>    120 weight units
    //                      ======================================
    //                                total: 400000 weight units
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400000);
    CheckIsStandard(t);

    // increase output size by one byte, so we end up with 400004 weight units
    t.vout[0].scriptPubKey = CScript() << OP_RETURN << std::vector<unsigned char>(20, 0); // output size: 31 bytes
    BOOST_CHECK_EQUAL(GetTransactionWeight(CTransaction(t)), 400004);
    CheckIsNotStandard(t, "tx-size");

    // Check bare multisig (standard if policy flag g_bare_multi is set)
    g_bare_multi = true;
    t.vout[0].scriptPubKey = GetScriptForMultisig(1, {key.GetPubKey()}); // simple 1-of-1
    t.vin.resize(1);
    t.vin[0].scriptSig = CScript() << std::vector<unsigned char>(65, 0);
    CheckIsStandard(t);

    g_bare_multi = false;
    CheckIsNotStandard(t, "bare-multisig");
    g_bare_multi = DEFAULT_PERMIT_BAREMULTISIG;

    // Check compressed P2PK outputs dust threshold (must have leading 02 or 03)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(33, 0x02) << OP_CHECKSIG;
    t.vout[0].nValue = 576;
    CheckIsStandard(t);
    t.vout[0].nValue = 575;
    CheckIsNotStandard(t, "dust");

    // Check uncompressed P2PK outputs dust threshold (must have leading 04/06/07)
    t.vout[0].scriptPubKey = CScript() << std::vector<unsigned char>(65, 0x04) << OP_CHECKSIG;
    t.vout[0].nValue = 672;
    CheckIsStandard(t);
    t.vout[0].nValue = 671;
    CheckIsNotStandard(t, "dust");

    // Check P2PKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_DUP << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUALVERIFY << OP_CHECKSIG;
    t.vout[0].nValue = 546;
    CheckIsStandard(t);
    t.vout[0].nValue = 545;
    CheckIsNotStandard(t, "dust");

    // Check P2SH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_HASH160 << std::vector<unsigned char>(20, 0) << OP_EQUAL;
    t.vout[0].nValue = 540;
    CheckIsStandard(t);
    t.vout[0].nValue = 539;
    CheckIsNotStandard(t, "dust");

    // Check P2WPKH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(20, 0);
    t.vout[0].nValue = 294;
    CheckIsStandard(t);
    t.vout[0].nValue = 293;
    CheckIsNotStandard(t, "dust");

    // Check P2WSH outputs dust threshold
    t.vout[0].scriptPubKey = CScript() << OP_0 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check P2TR outputs dust threshold (Invalid xonly key ok!)
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>(32, 0);
    t.vout[0].nValue = 330;
    CheckIsStandard(t);
    t.vout[0].nValue = 329;
    CheckIsNotStandard(t, "dust");

    // Check future Witness Program versions dust threshold (non-32-byte pushes are undefined for version 1)
    for (int op = OP_1; op <= OP_16; op += 1) {
        t.vout[0].scriptPubKey = CScript() << (opcodetype)op << std::vector<unsigned char>(2, 0);
        t.vout[0].nValue = 240;
        CheckIsStandard(t);

        t.vout[0].nValue = 239;
        CheckIsNotStandard(t, "dust");
    }

    // Check anchor outputs
    t.vout[0].scriptPubKey = CScript() << OP_1 << std::vector<unsigned char>{0x4e, 0x73};
    BOOST_CHECK(t.vout[0].scriptPubKey.IsPayToAnchor());
    t.vout[0].nValue = 240;
    CheckIsStandard(t);
    t.vout[0].nValue = 239;
    CheckIsNotStandard(t, "dust");
}